

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_arrow_collector.hpp
# Opt level: O1

void __thiscall duckdb::ArrowCollectorLocalState::FinishArray(ArrowCollectorLocalState *this)

{
  unique_ptr<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>,_true> *this_00;
  idx_t iVar1;
  _Head_base<0UL,_duckdb::ArrowAppender_*,_false> this_01;
  _Head_base<0UL,_duckdb::ArrowArrayWrapper_*,_false> _Var2;
  pointer pAVar3;
  pointer pAVar4;
  long lVar5;
  pointer *__ptr;
  ArrowArray *pAVar6;
  byte bVar7;
  templated_unique_single_t finished_array;
  _Head_base<0UL,_duckdb::ArrowArrayWrapper_*,_false> local_78;
  ArrowArray local_70;
  
  bVar7 = 0;
  local_78._M_head_impl = (ArrowArrayWrapper *)operator_new(0x50);
  ((local_78._M_head_impl)->arrow_array).length = 0;
  ((local_78._M_head_impl)->arrow_array).release = (_func_void_ArrowArray_ptr *)0x0;
  this_00 = &this->appender;
  pAVar3 = unique_ptr<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>,_true>::
           operator->(this_00);
  iVar1 = pAVar3->row_count;
  pAVar3 = unique_ptr<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>,_true>::
           operator->(this_00);
  ArrowAppender::Finalize(&local_70,pAVar3);
  pAVar4 = unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>
           ::operator->((unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>
                         *)&local_78);
  pAVar6 = &local_70;
  for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pAVar4->arrow_array).length = pAVar6->length;
    pAVar6 = (ArrowArray *)((long)pAVar6 + ((ulong)bVar7 * -2 + 1) * 8);
    pAVar4 = (pointer)((long)pAVar4 + ((ulong)bVar7 * -2 + 1) * 8);
  }
  this_01._M_head_impl =
       (this_00->
       super_unique_ptr<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>_>)._M_t.
       super___uniq_ptr_impl<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ArrowAppender_*,_std::default_delete<duckdb::ArrowAppender>_>.
       super__Head_base<0UL,_duckdb::ArrowAppender_*,_false>._M_head_impl;
  (this_00->super_unique_ptr<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>_>).
  _M_t.super___uniq_ptr_impl<duckdb::ArrowAppender,_std::default_delete<duckdb::ArrowAppender>_>.
  _M_t.super__Tuple_impl<0UL,_duckdb::ArrowAppender_*,_std::default_delete<duckdb::ArrowAppender>_>.
  super__Head_base<0UL,_duckdb::ArrowAppender_*,_false>._M_head_impl = (ArrowAppender *)0x0;
  if (this_01._M_head_impl != (ArrowAppender *)0x0) {
    ArrowAppender::~ArrowAppender(this_01._M_head_impl);
    operator_delete(this_01._M_head_impl);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,std::default_delete<duckdb::ArrowArrayWrapper>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,std::default_delete<duckdb::ArrowArrayWrapper>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,std::default_delete<duckdb::ArrowArrayWrapper>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,std::default_delete<duckdb::ArrowArrayWrapper>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,std::default_delete<duckdb::ArrowArrayWrapper>,true>>>
              *)&this->finished_arrays,
             (unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>
              *)&local_78);
  _Var2._M_head_impl = local_78._M_head_impl;
  this->tuple_count = this->tuple_count + iVar1;
  if (local_78._M_head_impl != (ArrowArrayWrapper *)0x0) {
    ArrowArrayWrapper::~ArrowArrayWrapper(local_78._M_head_impl);
    operator_delete(_Var2._M_head_impl);
  }
  return;
}

Assistant:

void FinishArray() {
		auto finished_array = make_uniq<ArrowArrayWrapper>();
		auto row_count = appender->RowCount();
		finished_array->arrow_array = appender->Finalize();
		appender.reset();
		finished_arrays.push_back(std::move(finished_array));
		tuple_count += row_count;
	}